

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::CreateTestCostList(cmCTestMultiProcessHandler *this)

{
  size_t *psVar1;
  TestMap *this_00;
  _Rb_tree_header *p_Var2;
  int iVar3;
  _Rb_tree_color _Var4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  ulong uVar6;
  mapped_type *ppcVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  _List_node_base *p_Var9;
  mapped_type *pmVar10;
  _Rb_tree_node_base *p_Var11;
  int *piVar12;
  _Base_ptr p_Var13;
  long lVar14;
  _List_node_base *p_Var15;
  _List_node_base *p_Var16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  _List_node_base **pp_Var20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var21;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar22;
  pair<int_*,_long> pVar23;
  undefined8 uStack_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_a0;
  int *piStack_98;
  _List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
  _Stack_88;
  TestComparator TStack_70;
  _List_node_base *p_Stack_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_60;
  
  if ((this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    uVar6 = (this->ParallelLevel).super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    if (uVar6 == 0) goto LAB_00294259;
  }
  else {
    if ((this->JobServerClient).super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
        super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
        super__Optional_payload_base<cmUVJobServerClient>._M_engaged != false) {
      _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &_Stack_60._M_impl.super__Rb_tree_header._M_header;
      _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&_Stack_88;
      _Stack_88._M_impl._M_node._M_size = 0;
      _Stack_88._M_impl._M_node.super__List_node_base._M_prev =
           _Stack_88._M_impl._M_node.super__List_node_base._M_next;
      _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::
      list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
      ::emplace_back<>((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                        *)_Stack_88._M_impl._M_node.super__List_node_base._M_next);
      p_Var13 = (this->PendingTests).
                super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 = &(this->PendingTests).
                super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                ._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var13 != p_Var2) {
        p_Var16 = _Stack_88._M_impl._M_node.super__List_node_base._M_prev + 1;
        uStack_b0 = (_List_node_base *)&this->OrderedTests;
        do {
          p_Var11 = p_Var13 + 1;
          ppcVar7 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&(this->Properties).
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,(key_type_conflict1 *)p_Var11);
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            ((this->LastTestsFailed).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (this->LastTestsFailed).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&(*ppcVar7)->Name);
          p_Var9 = p_Var16;
          if (_Var8._M_current !=
              (this->LastTestsFailed).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            p_Var9 = (_List_node_base *)operator_new(0x18);
            *(_Rb_tree_color *)&p_Var9[1]._M_next = p_Var11->_M_color;
            std::__detail::_List_node_base::_M_hook(p_Var9);
            psVar1 = &(this->OrderedTests).super__List_base<int,_std::allocator<int>_>._M_impl.
                      _M_node._M_size;
            *psVar1 = *psVar1 + 1;
            p_Var9 = (_List_node_base *)&_Stack_60;
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     p_Var9,(int *)p_Var11);
          p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
        } while ((_Rb_tree_header *)p_Var13 != p_Var2);
      }
      if (_Stack_88._M_impl._M_node.super__List_node_base._M_prev[3]._M_prev !=
          (_List_node_base *)0x0) {
        this_00 = &this->PendingTests;
        TStack_70.Handler = this;
        do {
          p_Var16 = _Stack_88._M_impl._M_node.super__List_node_base._M_prev;
          std::__cxx11::
          list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
          ::emplace_back<>((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                            *)&_Stack_88);
          p_Var9 = _Stack_88._M_impl._M_node.super__List_node_base._M_prev;
          p_Var11 = (_Rb_tree_node_base *)p_Var16[2]._M_prev;
          if (p_Var11 != (_Rb_tree_node_base *)&p_Var16[1]._M_prev) {
            p_Var15 = _Stack_88._M_impl._M_node.super__List_node_base._M_prev + 1;
            do {
              pmVar10 = std::
                        map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                        ::operator[](&this_00->
                                      super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
                                     ,(key_type_conflict1 *)(p_Var11 + 1));
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )p_Var15,(pmVar10->Depends).
                                  super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
                                  super__Rb_tree_header._M_header._M_left,
                         (_Rb_tree_const_iterator<int>)
                         &(pmVar10->Depends).super_set<int,_std::less<int>,_std::allocator<int>_>.
                          _M_t._M_impl.super__Rb_tree_header);
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
            } while (p_Var11 != (_Rb_tree_node_base *)&p_Var16[1]._M_prev);
          }
          this = TStack_70.Handler;
          p_Var11 = (_Rb_tree_node_base *)p_Var9[2]._M_prev;
          pp_Var20 = &p_Var9[1]._M_prev;
          if (p_Var11 != (_Rb_tree_node_base *)pp_Var20) {
            do {
              pVar22 = std::
                       _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       ::equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                      *)(p_Var16 + 1),(key_type_conflict1 *)(p_Var11 + 1));
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_erase_aux((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            *)(p_Var16 + 1),(_Base_ptr)pVar22.first._M_node,
                           (_Base_ptr)pVar22.second._M_node);
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
            } while (p_Var11 != (_Rb_tree_node_base *)pp_Var20);
          }
        } while (_Stack_88._M_impl._M_node.super__List_node_base._M_prev[3]._M_prev !=
                 (_List_node_base *)0x0);
      }
      p_Var16 = (_List_node_base *)&_Stack_88;
      std::__cxx11::
      list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
      ::_M_erase((list<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
                  *)p_Var16,(iterator)_Stack_88._M_impl._M_node.super__List_node_base._M_prev);
      p_Stack_68 = _Stack_88._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var16 != _Stack_88._M_impl._M_node.super__List_node_base._M_next) {
        do {
          _Stack_a8._M_current = (int *)0x0;
          _Stack_a0._M_current = (int *)0x0;
          piStack_98 = (int *)0x0;
          std::vector<int,std::allocator<int>>::_M_range_insert<std::_Rb_tree_const_iterator<int>>
                    ((vector<int,std::allocator<int>> *)&_Stack_a8,0,p_Var16->_M_prev[2]._M_prev,
                     &p_Var16->_M_prev[1]._M_prev);
          _Var5._M_current = _Stack_a0._M_current;
          _Var21._M_current = _Stack_a8._M_current;
          uStack_b0 = p_Var16;
          if (_Stack_a8._M_current != _Stack_a0._M_current) {
            lVar14 = (long)_Stack_a0._M_current - (long)_Stack_a8._M_current >> 2;
            pVar23 = std::get_temporary_buffer<int>((lVar14 - (lVar14 + 1 >> 0x3f)) + 1 >> 1);
            lVar14 = pVar23.second;
            piVar12 = pVar23.first;
            if (piVar12 == (int *)0x0) {
              lVar14 = 0;
              std::
              __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                        (_Var21,_Var5,(_Iter_comp_iter<TestComparator>)this);
            }
            else {
              std::
              __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                        (_Var21,_Var5,piVar12,lVar14,(_Iter_comp_iter<TestComparator>)this);
            }
            operator_delete(piVar12,lVar14 << 2);
            _Var5._M_current = _Stack_a0._M_current;
            for (_Var21._M_current = _Stack_a8._M_current; _Var21._M_current != _Var5._M_current;
                _Var21._M_current = _Var21._M_current + 1) {
              if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00297c3e:
                p_Var16 = (_List_node_base *)operator_new(0x18);
                *(int *)&p_Var16[1]._M_next = *_Var21._M_current;
                std::__detail::_List_node_base::_M_hook(p_Var16);
                *(long *)((long)this + 0x138) = *(long *)((long)this + 0x138) + 1;
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>
                          ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            *)&_Stack_60,_Var21._M_current);
              }
              else {
                iVar3 = *_Var21._M_current;
                p_Var13 = _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var19 = &_Stack_60._M_impl.super__Rb_tree_header._M_header;
                do {
                  p_Var18 = p_Var19;
                  p_Var17 = p_Var13;
                  _Var4 = p_Var17[1]._M_color;
                  p_Var19 = p_Var17;
                  if ((int)_Var4 < iVar3) {
                    p_Var19 = p_Var18;
                  }
                  p_Var13 = (&p_Var17->_M_left)[(int)_Var4 < iVar3];
                } while ((&p_Var17->_M_left)[(int)_Var4 < iVar3] != (_Base_ptr)0x0);
                if ((_Rb_tree_header *)p_Var19 == &_Stack_60._M_impl.super__Rb_tree_header)
                goto LAB_00297c3e;
                if ((int)_Var4 < iVar3) {
                  p_Var17 = p_Var18;
                }
                if (iVar3 < (int)p_Var17[1]._M_color) goto LAB_00297c3e;
              }
            }
          }
          if (_Stack_a8._M_current != (int *)0x0) {
            operator_delete(_Stack_a8._M_current,(long)piStack_98 - (long)_Stack_a8._M_current);
          }
          p_Var16 = uStack_b0->_M_prev;
        } while (p_Var16 != p_Stack_68);
      }
      std::__cxx11::
      _List_base<cmCTestMultiProcessHandler::TestSet,_std::allocator<cmCTestMultiProcessHandler::TestSet>_>
      ::_M_clear(&_Stack_88);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&_Stack_60);
      return;
    }
    uVar6 = this->ParallelLevelDefault;
  }
  if (uVar6 < 2) {
    _Stack_a8._M_current = (int *)0x0;
    _Stack_a0._M_current = (int *)0x0;
    piStack_98 = (int *)0x0;
    p_Var13 = (this->PendingTests).
              super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = &(this->PendingTests).
              super_map<int,_cmCTestMultiProcessHandler::TestInfo,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestInfo>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var13 != p_Var2) {
      do {
        if (_Stack_a0._M_current == piStack_98) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&_Stack_a8,(iterator)_Stack_a0._M_current,
                     (int *)(p_Var13 + 1));
        }
        else {
          *_Stack_a0._M_current = p_Var13[1]._M_color;
          _Stack_a0._M_current = _Stack_a0._M_current + 1;
        }
        p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
        _Var5._M_current = _Stack_a0._M_current;
        _Var21._M_current = _Stack_a8._M_current;
      } while ((_Rb_tree_header *)p_Var13 != p_Var2);
      if (_Stack_a8._M_current != _Stack_a0._M_current) {
        lVar14 = (long)_Stack_a0._M_current - (long)_Stack_a8._M_current >> 2;
        pVar23 = std::get_temporary_buffer<int>((lVar14 - (lVar14 + 1 >> 0x3f)) + 1 >> 1);
        lVar14 = pVar23.second;
        piVar12 = pVar23.first;
        if (piVar12 == (int *)0x0) {
          lVar14 = 0;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                    (_Var21,_Var5,(_Iter_comp_iter<TestComparator>)this);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_comp_iter<TestComparator>>
                    (_Var21,_Var5,piVar12,lVar14,(_Iter_comp_iter<TestComparator>)this);
        }
        operator_delete(piVar12,lVar14 << 2);
      }
    }
    p_Var2 = &_Stack_60._M_impl.super__Rb_tree_header;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    TStack_70.Handler = (cmCTestMultiProcessHandler *)_Stack_a0._M_current;
    if (_Stack_a8._M_current != _Stack_a0._M_current) {
      _Var21._M_current = _Stack_a8._M_current;
      do {
        iVar3 = *_Var21._M_current;
        uStack_b0 = (_List_node_base *)CONCAT44(iVar3,(int)uStack_b0);
        p_Var13 = _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var19 = &p_Var2->_M_header;
        if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00297e9c:
          _Stack_88._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
          _Stack_88._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
          _Stack_88._M_impl._M_node._M_size = 0;
          p_Stack_68 = (_List_node_base *)_Var21._M_current;
          GetAllTestDependencies(this,iVar3,(TestList *)&_Stack_88);
          p_Var16 = _Stack_88._M_impl._M_node.super__List_node_base._M_prev;
          for (p_Var9 = _Stack_88._M_impl._M_node.super__List_node_base._M_next; p_Var9 != p_Var16;
              p_Var9 = (_List_node_base *)((long)&p_Var9->_M_next + 4)) {
            iVar3 = *(int *)&p_Var9->_M_next;
            uStack_b0 = (_List_node_base *)CONCAT44(uStack_b0._4_4_,iVar3);
            p_Var13 = _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var19 = &p_Var2->_M_header;
            if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00297f14:
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&_Stack_60,(int *)&uStack_b0);
              p_Var15 = (_List_node_base *)operator_new(0x18);
              *(int *)&p_Var15[1]._M_next = (int)uStack_b0;
              std::__detail::_List_node_base::_M_hook(p_Var15);
              psVar1 = &(this->OrderedTests).super__List_base<int,_std::allocator<int>_>._M_impl.
                        _M_node._M_size;
              *psVar1 = *psVar1 + 1;
            }
            else {
              do {
                p_Var18 = p_Var19;
                p_Var17 = p_Var13;
                _Var4 = p_Var17[1]._M_color;
                p_Var19 = p_Var17;
                if ((int)_Var4 < iVar3) {
                  p_Var19 = p_Var18;
                }
                p_Var13 = (&p_Var17->_M_left)[(int)_Var4 < iVar3];
              } while ((&p_Var17->_M_left)[(int)_Var4 < iVar3] != (_Base_ptr)0x0);
              if ((_Rb_tree_header *)p_Var19 == p_Var2) goto LAB_00297f14;
              if ((int)_Var4 < iVar3) {
                p_Var17 = p_Var18;
              }
              if (iVar3 < (int)p_Var17[1]._M_color) goto LAB_00297f14;
            }
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &_Stack_60,(int *)((long)&uStack_b0 + 4));
          p_Var16 = (_List_node_base *)operator_new(0x18);
          *(undefined4 *)&p_Var16[1]._M_next = uStack_b0._4_4_;
          std::__detail::_List_node_base::_M_hook(p_Var16);
          _Var21._M_current = (int *)p_Stack_68;
          psVar1 = &(this->OrderedTests).super__List_base<int,_std::allocator<int>_>._M_impl._M_node
                    ._M_size;
          *psVar1 = *psVar1 + 1;
          if (_Stack_88._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
            operator_delete(_Stack_88._M_impl._M_node.super__List_node_base._M_next,
                            _Stack_88._M_impl._M_node._M_size -
                            (long)_Stack_88._M_impl._M_node.super__List_node_base._M_next);
          }
        }
        else {
          do {
            p_Var18 = p_Var19;
            p_Var17 = p_Var13;
            _Var4 = p_Var17[1]._M_color;
            p_Var19 = p_Var17;
            if ((int)_Var4 < iVar3) {
              p_Var19 = p_Var18;
            }
            p_Var13 = (&p_Var17->_M_left)[(int)_Var4 < iVar3];
          } while ((&p_Var17->_M_left)[(int)_Var4 < iVar3] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var19 == p_Var2) goto LAB_00297e9c;
          if ((int)_Var4 < iVar3) {
            p_Var17 = p_Var18;
          }
          if (iVar3 < (int)p_Var17[1]._M_color) goto LAB_00297e9c;
        }
        _Var21._M_current = _Var21._M_current + 1;
      } while ((cmCTestMultiProcessHandler *)_Var21._M_current != TStack_70.Handler);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&_Stack_60);
    if (_Stack_a8._M_current != (int *)0x0) {
      operator_delete(_Stack_a8._M_current,(long)piStack_98 - (long)_Stack_a8._M_current);
    }
    return;
  }
LAB_00294259:
  CreateParallelTestCostList(this);
  return;
}

Assistant:

size_t cmCTestMultiProcessHandler::GetParallelLevel() const
{
  if ((this->ParallelLevel && *this->ParallelLevel == 0) ||
      (!this->ParallelLevel && this->JobServerClient)) {
    return kParallelLevelUnbounded;
  }
  if (this->ParallelLevel) {
    return *this->ParallelLevel;
  }
  return this->ParallelLevelDefault;
}